

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshints.c
# Opt level: O2

void cf2_glyphpath_pushPrevElem
               (CF2_GlyphPath glyphpath,CF2_HintMap hintmap,FT_Vector *nextP0,FT_Vector nextP1,
               FT_Bool close)

{
  FT_Pos FVar1;
  FT_Vector *pFVar2;
  int iVar3;
  FT_Long FVar4;
  int iVar5;
  int iVar6;
  CF2_F16Dot16 CVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  CF2_HintMap hintmap_00;
  CF2_F16Dot16 CVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  FT_Vector *pFVar17;
  ulong uVar18;
  bool bVar19;
  FT_Pos local_a0;
  CF2_CallbackParamsRec params;
  
  bVar19 = glyphpath->prevElemOp != 2;
  pFVar17 = &glyphpath->prevElemP3;
  pFVar2 = &glyphpath->prevElemP2;
  if (!bVar19) {
    pFVar17 = &glyphpath->prevElemP1;
    pFVar2 = &glyphpath->prevElemP0;
  }
  uVar18 = (ulong)bVar19;
  uVar9 = uVar18 * 0x20;
  lVar14 = (&glyphpath->prevElemP1)[uVar18 * 2].x;
  if (pFVar17->y == nextP0->y && lVar14 == nextP0->x) {
LAB_00151939:
    local_a0 = 0;
    lVar14 = 0;
    bVar19 = true;
  }
  else {
    uVar18 = uVar9 | 0x4980;
    iVar5 = *(int *)((long)(glyphpath->hintMap).edge + (uVar18 - 0x38));
    iVar6 = (int)pFVar2->y;
    iVar8 = (int)nextP0->x;
    iVar3 = (int)nextP0->y;
    lVar13 = (long)(((int)nextP1.y - iVar3) + 0x10 >> 5);
    lVar11 = (((int)lVar14 - iVar5) + 0x10 >> 5) * lVar13;
    lVar14 = (long)(((int)nextP1.x - iVar8) + 0x10 >> 5);
    lVar16 = (((int)pFVar17->y - iVar6) + 0x10 >> 5) * lVar14;
    iVar10 = (int)((ulong)(lVar11 + 0x8000 + (lVar11 >> 0x3f)) >> 0x10);
    iVar15 = (int)((ulong)(lVar16 + 0x8000 + (lVar16 >> 0x3f)) >> 0x10);
    if (iVar10 == iVar15) goto LAB_00151939;
    uVar9 = uVar9 | 0x4990;
    lVar13 = lVar13 * ((iVar8 - iVar5) + 0x10 >> 5);
    lVar14 = ((iVar3 - iVar6) + 0x10 >> 5) * lVar14;
    FVar4 = FT_DivFix((long)((int)((ulong)(lVar13 + 0x8000 + (lVar13 >> 0x3f)) >> 0x10) -
                            (int)((ulong)(lVar14 + 0x8000 + (lVar14 >> 0x3f)) >> 0x10)),
                      (long)(iVar10 - iVar15));
    lVar14 = *(long *)((long)(glyphpath->hintMap).edge + (uVar18 - 0x38));
    lVar11 = *(long *)((long)(glyphpath->hintMap).edge + (uVar9 - 0x38));
    iVar3 = (int)lVar11;
    lVar13 = (long)(iVar3 - (int)lVar14) * (long)(int)FVar4;
    iVar5 = (int)((ulong)(lVar13 + 0x8000 + (lVar13 >> 0x3f)) >> 0x10);
    local_a0 = (FT_Pos)(iVar5 + (int)lVar14);
    lVar13 = pFVar2->y;
    iVar8 = (int)pFVar17->y;
    lVar16 = (long)(iVar8 - (int)lVar13) * (long)(int)FVar4;
    iVar6 = (int)((ulong)(lVar16 + 0x8000 + (lVar16 >> 0x3f)) >> 0x10);
    if (lVar11 == lVar14) {
      iVar10 = -iVar5;
      if (0 < iVar5) {
        iVar10 = iVar5;
      }
      if (iVar10 < glyphpath->snapThreshold) {
        local_a0 = lVar14;
      }
    }
    lVar14 = (long)(iVar6 + (int)lVar13);
    if (pFVar17->y == lVar13) {
      iVar5 = -iVar6;
      if (0 < iVar6) {
        iVar5 = iVar6;
      }
      if (iVar5 < glyphpath->snapThreshold) {
        lVar14 = lVar13;
      }
    }
    if (nextP0->x == nextP1.x) {
      iVar6 = (int)local_a0 - (int)nextP1.x;
      iVar5 = -iVar6;
      if (0 < iVar6) {
        iVar5 = iVar6;
      }
      if (iVar5 < glyphpath->snapThreshold) {
        local_a0 = nextP1.x;
      }
    }
    if (nextP0->y == nextP1.y) {
      iVar6 = (int)lVar14 - (int)nextP1.y;
      iVar5 = -iVar6;
      if (0 < iVar6) {
        iVar5 = iVar6;
      }
      if (iVar5 < glyphpath->snapThreshold) {
        lVar14 = nextP1.y;
      }
    }
    lVar13 = local_a0 - ((int)nextP0->x + iVar3) / 2;
    lVar11 = lVar13 * -0x100000000 >> 0x20;
    if (-1 < lVar13) {
      lVar11 = lVar13;
    }
    if (glyphpath->miterLimit < lVar11) {
      bVar19 = true;
    }
    else {
      lVar13 = lVar14 - ((int)nextP0->y + iVar8) / 2;
      lVar11 = lVar13 * -0x100000000 >> 0x20;
      if (-1 < lVar13) {
        lVar11 = lVar13;
      }
      if (glyphpath->miterLimit < lVar11) {
        bVar19 = true;
      }
      else {
        *(FT_Pos *)((long)(glyphpath->hintMap).edge + (uVar9 - 0x38)) = local_a0;
        pFVar17->y = lVar14;
        bVar19 = false;
      }
    }
  }
  pFVar2 = &glyphpath->currentDS;
  params.pt0.x = (glyphpath->currentDS).x;
  params.pt0.y = (glyphpath->currentDS).y;
  if (glyphpath->prevElemOp == 4) {
    params.op = 4;
    cf2_glyphpath_hintPoint
              (glyphpath,hintmap,&params.pt1,(CF2_F16Dot16)(glyphpath->prevElemP1).x,
               (CF2_F16Dot16)(glyphpath->prevElemP1).y);
    cf2_glyphpath_hintPoint
              (glyphpath,hintmap,&params.pt2,(CF2_F16Dot16)(glyphpath->prevElemP2).x,
               (CF2_F16Dot16)(glyphpath->prevElemP2).y);
    pFVar17 = &params.pt3;
    cf2_glyphpath_hintPoint
              (glyphpath,hintmap,pFVar17,(CF2_F16Dot16)(glyphpath->prevElemP3).x,
               (CF2_F16Dot16)(glyphpath->prevElemP3).y);
    lVar11 = 0x18;
  }
  else {
    if (glyphpath->prevElemOp != 2) goto LAB_00151c1f;
    params.op = 2;
    if (close == '\0') {
      CVar7 = (CF2_F16Dot16)(glyphpath->prevElemP1).x;
      CVar12 = (CF2_F16Dot16)(glyphpath->prevElemP1).y;
      hintmap_00 = hintmap;
    }
    else {
      CVar7 = (CF2_F16Dot16)(glyphpath->prevElemP1).x;
      CVar12 = (CF2_F16Dot16)(glyphpath->prevElemP1).y;
      hintmap_00 = &glyphpath->firstHintMap;
    }
    cf2_glyphpath_hintPoint(glyphpath,hintmap_00,&params.pt1,CVar7,CVar12);
    pFVar17 = &params.pt1;
    lVar11 = 8;
    if ((params.pt0.x == params.pt1.x) && (params.pt0.y == params.pt1.y)) goto LAB_00151c1f;
  }
  (**(code **)((long)&glyphpath->callbacks->moveTo + lVar11))(glyphpath->callbacks,&params);
  FVar1 = pFVar17->y;
  pFVar2->x = pFVar17->x;
  (glyphpath->currentDS).y = FVar1;
LAB_00151c1f:
  if (!(bool)(close == '\0' & (bVar19 ^ 1U))) {
    if (close == '\0') {
      CVar7 = (CF2_F16Dot16)nextP0->x;
      CVar12 = (CF2_F16Dot16)nextP0->y;
    }
    else {
      hintmap = &glyphpath->firstHintMap;
      CVar7 = (CF2_F16Dot16)nextP0->x;
      CVar12 = (CF2_F16Dot16)nextP0->y;
    }
    cf2_glyphpath_hintPoint(glyphpath,hintmap,&params.pt1,CVar7,CVar12);
    if ((params.pt1.x != pFVar2->x) || (params.pt1.y != (glyphpath->currentDS).y)) {
      params.op = 2;
      params.pt0.x = pFVar2->x;
      params.pt0.y = (glyphpath->currentDS).y;
      (*glyphpath->callbacks->lineTo)(glyphpath->callbacks,&params);
      pFVar2->x = params.pt1.x;
      (glyphpath->currentDS).y = params.pt1.y;
    }
  }
  if (!bVar19) {
    nextP0->x = local_a0;
    nextP0->y = lVar14;
  }
  return;
}

Assistant:

static void
  cf2_glyphpath_pushPrevElem( CF2_GlyphPath  glyphpath,
                              CF2_HintMap    hintmap,
                              FT_Vector*     nextP0,
                              FT_Vector      nextP1,
                              FT_Bool        close )
  {
    CF2_CallbackParamsRec  params;

    FT_Vector*  prevP0;
    FT_Vector*  prevP1;

    FT_Vector  intersection    = { 0, 0 };
    FT_Bool    useIntersection = FALSE;


    FT_ASSERT( glyphpath->prevElemOp == CF2_PathOpLineTo ||
               glyphpath->prevElemOp == CF2_PathOpCubeTo );

    if ( glyphpath->prevElemOp == CF2_PathOpLineTo )
    {
      prevP0 = &glyphpath->prevElemP0;
      prevP1 = &glyphpath->prevElemP1;
    }
    else
    {
      prevP0 = &glyphpath->prevElemP2;
      prevP1 = &glyphpath->prevElemP3;
    }

    /* optimization: if previous and next elements are offset by the same */
    /* amount, then there will be no gap, and no need to compute an       */
    /* intersection.                                                      */
    if ( prevP1->x != nextP0->x || prevP1->y != nextP0->y )
    {
      /* previous element does not join next element:             */
      /* adjust end point of previous element to the intersection */
      useIntersection = cf2_glyphpath_computeIntersection( glyphpath,
                                                           prevP0,
                                                           prevP1,
                                                           nextP0,
                                                           &nextP1,
                                                           &intersection );
      if ( useIntersection )
      {
        /* modify the last point of the cached element (either line or */
        /* curve)                                                      */
        *prevP1 = intersection;
      }
    }

    params.pt0 = glyphpath->currentDS;

    switch( glyphpath->prevElemOp )
    {
    case CF2_PathOpLineTo:
      params.op = CF2_PathOpLineTo;

      /* note: pt2 and pt3 are unused */

      if ( close )
      {
        /* use first hint map if closing */
        cf2_glyphpath_hintPoint( glyphpath,
                                 &glyphpath->firstHintMap,
                                 &params.pt1,
                                 glyphpath->prevElemP1.x,
                                 glyphpath->prevElemP1.y );
      }
      else
      {
        cf2_glyphpath_hintPoint( glyphpath,
                                 hintmap,
                                 &params.pt1,
                                 glyphpath->prevElemP1.x,
                                 glyphpath->prevElemP1.y );
      }

      /* output only non-zero length lines */
      if ( params.pt0.x != params.pt1.x || params.pt0.y != params.pt1.y )
      {
        glyphpath->callbacks->lineTo( glyphpath->callbacks, &params );

        glyphpath->currentDS = params.pt1;
      }
      break;

    case CF2_PathOpCubeTo:
      params.op = CF2_PathOpCubeTo;

      /* TODO: should we intersect the interior joins (p1-p2 and p2-p3)? */
      cf2_glyphpath_hintPoint( glyphpath,
                               hintmap,
                               &params.pt1,
                               glyphpath->prevElemP1.x,
                               glyphpath->prevElemP1.y );
      cf2_glyphpath_hintPoint( glyphpath,
                               hintmap,
                               &params.pt2,
                               glyphpath->prevElemP2.x,
                               glyphpath->prevElemP2.y );
      cf2_glyphpath_hintPoint( glyphpath,
                               hintmap,
                               &params.pt3,
                               glyphpath->prevElemP3.x,
                               glyphpath->prevElemP3.y );

      glyphpath->callbacks->cubeTo( glyphpath->callbacks, &params );

      glyphpath->currentDS = params.pt3;

      break;
    }

    if ( !useIntersection || close )
    {
      /* insert connecting line between end of previous element and start */
      /* of current one                                                   */
      /* note: at the end of a subpath, we might do both, so use `nextP0' */
      /* before we change it, below                                       */

      if ( close )
      {
        /* if we are closing the subpath, then nextP0 is in the first     */
        /* hint zone                                                      */
        cf2_glyphpath_hintPoint( glyphpath,
                                 &glyphpath->firstHintMap,
                                 &params.pt1,
                                 nextP0->x,
                                 nextP0->y );
      }
      else
      {
        cf2_glyphpath_hintPoint( glyphpath,
                                 hintmap,
                                 &params.pt1,
                                 nextP0->x,
                                 nextP0->y );
      }

      if ( params.pt1.x != glyphpath->currentDS.x ||
           params.pt1.y != glyphpath->currentDS.y )
      {
        /* length is nonzero */
        params.op  = CF2_PathOpLineTo;
        params.pt0 = glyphpath->currentDS;

        /* note: pt2 and pt3 are unused */
        glyphpath->callbacks->lineTo( glyphpath->callbacks, &params );

        glyphpath->currentDS = params.pt1;
      }
    }

    if ( useIntersection )
    {
      /* return intersection point to caller */
      *nextP0 = intersection;
    }
  }